

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_parse_headers.c
# Opt level: O0

IHEVCD_ERROR_T ihevcd_parse_pic_timing_sei(codec_t *ps_codec,sps_t *ps_sps)

{
  bool bVar1;
  UWORD32 UVar2;
  bitstrm_t *ps_bitstrm_00;
  bitstrm_t *ps_bitstrm_01;
  long in_RSI;
  long in_RDI;
  pic_timing_sei_params_t *ps_pic_timing;
  UWORD32 u4_cpb_dpb_delays_present_flag;
  hrd_params_t *ps_vui_hdr;
  UWORD32 i;
  vui_t *ps_vui;
  UWORD32 value;
  bitstrm_t *ps_bitstrm;
  parse_ctxt_t *ps_parse;
  uint local_34;
  
  ps_bitstrm_00 = (bitstrm_t *)(in_RDI + 0x218);
  ps_bitstrm_01 = (bitstrm_t *)(in_RSI + 0xa0);
  *(undefined1 *)(in_RDI + 0x813) = 1;
  if (*(char *)(in_RSI + 0x88) != '\0') {
    UVar2 = ihevcd_bits_get(ps_bitstrm_00,4);
    *(UWORD32 *)(in_RDI + 0xc4c) = UVar2;
    UVar2 = ihevcd_bits_get(ps_bitstrm_00,2);
    *(UWORD32 *)(in_RDI + 0xc50) = UVar2;
    UVar2 = ihevcd_bits_get(ps_bitstrm_00,1);
    *(char *)(in_RDI + 0xc54) = (char)UVar2;
  }
  if ((ps_bitstrm_01->field_0xc == '\0') && (ps_bitstrm_01->field_0xd == '\0')) {
    bVar1 = false;
  }
  else {
    bVar1 = true;
  }
  if (bVar1) {
    UVar2 = ihevcd_bits_get(ps_bitstrm_00,*(byte *)((long)&ps_bitstrm_01->pu1_buf_max + 1) + 1);
    *(UWORD32 *)(in_RDI + 0xc58) = UVar2;
    UVar2 = ihevcd_bits_get(ps_bitstrm_00,*(byte *)((long)&ps_bitstrm_01->pu1_buf_max + 2) + 1);
    *(UWORD32 *)(in_RDI + 0xc5c) = UVar2;
    if (ps_bitstrm_01->field_0xf != '\0') {
      UVar2 = ihevcd_bits_get(ps_bitstrm_00,*(byte *)((long)&ps_bitstrm_01->pu4_buf + 3) + 1);
      *(UWORD32 *)(in_RDI + 0xc60) = UVar2;
    }
    if ((ps_bitstrm_01->field_0xf != '\0') && (*(char *)((long)&ps_bitstrm_01->pu4_buf + 2) != '\0')
       ) {
      UVar2 = ihevcd_uev(ps_bitstrm_01);
      *(UWORD32 *)(in_RDI + 0xc64) = UVar2;
      UVar2 = ihevcd_bits_get(ps_bitstrm_00,1);
      *(char *)(in_RDI + 0xc68) = (char)UVar2;
      if (*(char *)(in_RDI + 0xc68) != '\0') {
        UVar2 = ihevcd_bits_get(ps_bitstrm_00,*(byte *)((long)&ps_bitstrm_01->pu4_buf + 1) + 1);
        *(UWORD32 *)(in_RDI + 0xc6c) = UVar2;
      }
      for (local_34 = 0; local_34 <= *(uint *)(in_RDI + 0xc64); local_34 = local_34 + 1) {
        UVar2 = ihevcd_uev(ps_bitstrm_01);
        *(UWORD32 *)(in_RDI + 0xc70 + (ulong)local_34 * 4) = UVar2;
        if ((*(char *)(in_RDI + 0xc68) == '\0') && (local_34 < *(uint *)(in_RDI + 0xc64))) {
          UVar2 = ihevcd_bits_get(ps_bitstrm_00,*(byte *)((long)&ps_bitstrm_01->pu4_buf + 1) + 1);
          *(UWORD32 *)(in_RDI + 0x10a8 + (ulong)local_34 * 4) = UVar2;
        }
      }
    }
  }
  return 0;
}

Assistant:

IHEVCD_ERROR_T ihevcd_parse_pic_timing_sei(codec_t *ps_codec, sps_t *ps_sps)
{
    parse_ctxt_t *ps_parse = &ps_codec->s_parse;
    bitstrm_t *ps_bitstrm = &ps_parse->s_bitstrm;
    UWORD32 value;
    vui_t *ps_vui;
    UWORD32 i;
    hrd_params_t *ps_vui_hdr;
    UWORD32 u4_cpb_dpb_delays_present_flag = 0;
    pic_timing_sei_params_t *ps_pic_timing;

    ps_pic_timing = &ps_parse->s_sei_params.s_pic_timing_sei_params;
    ps_vui = &ps_sps->s_vui_parameters;
    ps_vui_hdr = &ps_vui->s_vui_hrd_parameters;
    ps_parse->s_sei_params.i1_pic_timing_params_present_flag = 1;
    if(ps_vui->u1_frame_field_info_present_flag)
    {
        BITS_PARSE("pic_struct", value, ps_bitstrm, 4);
        ps_pic_timing->u4_pic_struct = value;

        BITS_PARSE("source_scan_type", value, ps_bitstrm, 2);
        ps_pic_timing->u4_source_scan_type = value;

        BITS_PARSE("duplicate_flag", value, ps_bitstrm, 1);
        ps_pic_timing->u1_duplicate_flag = value;
    }

    if(ps_vui_hdr->u1_nal_hrd_parameters_present_flag
                    || ps_vui_hdr->u1_vcl_hrd_parameters_present_flag)
    {
        u4_cpb_dpb_delays_present_flag = 1;
    }
    else
    {
        u4_cpb_dpb_delays_present_flag = 0;
    }

    if(u4_cpb_dpb_delays_present_flag)
    {
        BITS_PARSE("au_cpb_removal_delay_minus1", value, ps_bitstrm,
                   (ps_vui_hdr->u1_au_cpb_removal_delay_length_minus1 + 1));
        ps_pic_timing->u4_au_cpb_removal_delay_minus1 = value;

        BITS_PARSE("pic_dpb_output_delay", value, ps_bitstrm,
                   (ps_vui_hdr->u1_dpb_output_delay_length_minus1 + 1));
        ps_pic_timing->u4_pic_dpb_output_delay = value;

        if(ps_vui_hdr->u1_sub_pic_cpb_params_present_flag)
        {
            BITS_PARSE("pic_dpb_output_du_delay", value, ps_bitstrm,
                       (ps_vui_hdr->u1_dpb_output_delay_du_length_minus1 + 1));
            ps_pic_timing->u4_pic_dpb_output_du_delay = value;
        }

        if(ps_vui_hdr->u1_sub_pic_cpb_params_present_flag
                        && ps_vui_hdr->u1_sub_pic_cpb_params_in_pic_timing_sei_flag)
        {
            UEV_PARSE("num_decoding_units_minus1", value, ps_bitstrm);
            ps_pic_timing->u4_num_decoding_units_minus1 = value;

            BITS_PARSE("du_common_cpb_removal_delay_flag", value, ps_bitstrm, 1);
            ps_pic_timing->u1_du_common_cpb_removal_delay_flag = value;

            if(ps_pic_timing->u1_du_common_cpb_removal_delay_flag)
            {
                BITS_PARSE("du_common_cpb_removal_delay_increment_minus1",
                           value,
                           ps_bitstrm,
                           (ps_vui_hdr->u1_du_cpb_removal_delay_increment_length_minus1
                                           + 1));
                ps_pic_timing->u4_du_common_cpb_removal_delay_increment_minus1 =
                                value;
            }

            for(i = 0; i <= ps_pic_timing->u4_num_decoding_units_minus1; i++)
            {
                UEV_PARSE("num_nalus_in_du_minus1", value, ps_bitstrm);
                ps_pic_timing->au4_num_nalus_in_du_minus1[i] = value;

                if((!ps_pic_timing->u1_du_common_cpb_removal_delay_flag)
                                && (i < ps_pic_timing->u4_num_decoding_units_minus1))
                {
                    BITS_PARSE("du_common_cpb_removal_delay_increment_minus1",
                               value,
                               ps_bitstrm,
                               (ps_vui_hdr->u1_du_cpb_removal_delay_increment_length_minus1
                                               + 1));
                    ps_pic_timing->au4_du_cpb_removal_delay_increment_minus1[i] =
                                    value;
                }
            }
        }
    }

    return (IHEVCD_ERROR_T)IHEVCD_SUCCESS;
}